

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FateDeck.cpp
# Opt level: O1

void __thiscall FateDeck::~FateDeck(FateDeck *this)

{
  list<GreenCard_*,_std::allocator<GreenCard_*>_> *this_00;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_Deck)._vptr_Deck = (_func_int **)&PTR_revealDeck_001180f0;
  this_00 = &this->fateDeck;
  p_Var2 = (this->fateDeck).super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)this_00) {
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::remove
              (this_00,(char *)(p_Var2 + 1));
    p_Var2 = ((this_00->super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>)._M_impl._M_node
              .super__List_node_base._M_next)->_M_next;
  }
  p_Var2 = (this_00->super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)this_00) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  Deck::~Deck(&this->super_Deck);
  return;
}

Assistant:

FateDeck::~FateDeck()
{
    list<GreenCard*>::iterator itf;
    for (itf = fateDeck.begin(); itf != fateDeck.end(); itf++)
    {
        fateDeck.remove((*itf));
        //delete *itf;
        itf = fateDeck.begin();
    }
}